

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vanilla_chronicle.cpp
# Opt level: O1

void __thiscall
cornelich::vanilla_chronicle::vanilla_chronicle
          (vanilla_chronicle *this,vanilla_chronicle_settings *settings)

{
  pointer pcVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  double dVar3;
  int64_t iVar4;
  int64_t iVar5;
  size_t sVar6;
  int32_t iVar7;
  ulong uVar8;
  int iVar9;
  
  (this->m_settings).m_path._M_dataplus._M_p = (pointer)&(this->m_settings).m_path.field_2;
  pcVar1 = (settings->m_path)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar1,pcVar1 + (settings->m_path)._M_string_length);
  iVar7 = settings->m_cycle_length;
  (this->m_settings).m_thread_id_bits = settings->m_thread_id_bits;
  (this->m_settings).m_cycle_length = iVar7;
  (this->m_settings).m_cycle_format.
  super___shared_ptr<cornelich::cycle_formatter,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (settings->m_cycle_format).
       super___shared_ptr<cornelich::cycle_formatter,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var2 = (settings->m_cycle_format).
           super___shared_ptr<cornelich::cycle_formatter,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (this->m_settings).m_cycle_format.
  super___shared_ptr<cornelich::cycle_formatter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var2;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  iVar4 = settings->m_index_block_size;
  iVar5 = settings->m_data_block_size;
  sVar6 = settings->m_index_cache_size;
  (this->m_settings).m_entries_per_cycle = settings->m_entries_per_cycle;
  (this->m_settings).m_index_block_size = iVar4;
  (this->m_settings).m_data_cache_size = settings->m_data_cache_size;
  (this->m_settings).m_data_block_size = iVar5;
  (this->m_settings).m_index_cache_size = sVar6;
  dVar3 = log2((double)(this->m_settings).m_index_block_size);
  iVar9 = (int)dVar3;
  this->m_index_block_size_bits = iVar9;
  uVar8 = -1L << ((byte)iVar9 & 0x3f) ^ 0xffffffffffffffff;
  this->m_index_block_size_mask = uVar8;
  this->m_index_block_longs_bits = iVar9 + -3;
  this->m_index_block_longs_mask = uVar8 >> 3;
  dVar3 = log2((double)(this->m_settings).m_data_block_size);
  this->m_data_block_size_bits = (int)dVar3;
  this->m_data_block_size_mask = ~(-1L << ((byte)(int)dVar3 & 0x3f));
  dVar3 = log2((double)(this->m_settings).m_entries_per_cycle);
  this->m_entries_for_cycle_bits = (int)dVar3;
  this->m_entries_for_cycle_mask = ~(-1L << ((byte)(int)dVar3 & 0x3f));
  vanilla_index::vanilla_index(&this->m_index,&this->m_settings,this->m_index_block_size_bits);
  vanilla_data::vanilla_data(&this->m_data,&this->m_settings,this->m_data_block_size_bits);
  (this->m_last_written_index).super___atomic_base<long>._M_i = -1;
  return;
}

Assistant:

vanilla_chronicle::vanilla_chronicle(const vanilla_chronicle_settings & settings)
    : m_settings(settings)
    , m_index_block_size_bits( (std::int32_t)std::log2(m_settings.index_block_size()) )
    , m_index_block_size_mask( ((std::int64_t)1 << m_index_block_size_bits) - 1 )
    , m_index_block_longs_bits( m_index_block_size_bits - 3 )
    , m_index_block_longs_mask( util::right_shift(m_index_block_size_mask, 3) )
    , m_data_block_size_bits( (std::int32_t)std::log2(m_settings.data_block_size()) )
    , m_data_block_size_mask( ((std::int64_t)1 << m_data_block_size_bits) - 1 )
    , m_entries_for_cycle_bits( (std::int32_t)std::log2(m_settings.entries_per_cycle()) )
    , m_entries_for_cycle_mask( ((std::int64_t)1 << m_entries_for_cycle_bits) - 1 )
    , m_index(m_settings, m_index_block_size_bits)
    , m_data(m_settings, m_data_block_size_bits)
    , m_last_written_index(-1)
{
}